

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRestruct.c
# Opt level: O3

int Abc_Abc_NodeResubCollectDivs(Abc_ManRst_t *p,Abc_Obj_t *pRoot,Cut_Cut_t *pCut)

{
  int iVar1;
  uint uVar2;
  undefined4 uVar3;
  Abc_Ntk_t *pAVar4;
  long *plVar5;
  long *plVar6;
  long lVar7;
  long *plVar8;
  int *__s;
  void **ppvVar9;
  Vec_Ptr_t *pVVar10;
  int iVar11;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  
  p->vDecs->nSize = 0;
  pAVar4 = pRoot->pNtk;
  if ((pAVar4->vTravIds).pArray == (int *)0x0) {
    iVar1 = pAVar4->vObjs->nSize;
    uVar14 = (long)iVar1 + 500;
    iVar11 = (int)uVar14;
    if ((pAVar4->vTravIds).nCap < iVar11) {
      __s = (int *)malloc(uVar14 * 4);
      (pAVar4->vTravIds).pArray = __s;
      if (__s == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pAVar4->vTravIds).nCap = iVar11;
    }
    else {
      __s = (int *)0x0;
    }
    if (-500 < iVar1) {
      memset(__s,0,(uVar14 & 0xffffffff) << 2);
    }
    (pAVar4->vTravIds).nSize = iVar11;
  }
  iVar1 = pAVar4->nTravIds;
  pAVar4->nTravIds = iVar1 + 1;
  if (0x3ffffffe < iVar1) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  if (0xfffffff < *(uint *)pCut) {
    uVar14 = 0;
    do {
      iVar1 = *(int *)(&pCut[1].field_0x0 + uVar14 * 4);
      if (((long)iVar1 < 0) || (pVVar10 = pRoot->pNtk->vObjs, pVVar10->nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      plVar5 = (long *)pVVar10->pArray[iVar1];
      if (plVar5 == (long *)0x0) {
        return 0;
      }
      pVVar10 = p->vDecs;
      uVar2 = pVVar10->nSize;
      if (uVar2 == pVVar10->nCap) {
        if ((int)uVar2 < 0x10) {
          if (pVVar10->pArray == (void **)0x0) {
            ppvVar9 = (void **)malloc(0x80);
          }
          else {
            ppvVar9 = (void **)realloc(pVVar10->pArray,0x80);
          }
          pVVar10->pArray = ppvVar9;
          pVVar10->nCap = 0x10;
        }
        else {
          if (pVVar10->pArray == (void **)0x0) {
            ppvVar9 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar9 = (void **)realloc(pVVar10->pArray,(ulong)uVar2 << 4);
          }
          pVVar10->pArray = ppvVar9;
          pVVar10->nCap = uVar2 * 2;
        }
      }
      else {
        ppvVar9 = pVVar10->pArray;
      }
      iVar1 = pVVar10->nSize;
      iVar11 = iVar1 + 1;
      pVVar10->nSize = iVar11;
      ppvVar9[iVar1] = plVar5;
      lVar13 = *plVar5;
      iVar1 = (int)plVar5[2];
      uVar3 = *(undefined4 *)(lVar13 + 0xd8);
      Vec_IntFillExtra((Vec_Int_t *)(lVar13 + 0xe0),iVar1 + 1,iVar11);
      if (((long)iVar1 < 0) || (*(int *)(lVar13 + 0xe4) <= iVar1)) {
LAB_002a2cc9:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      *(undefined4 *)(*(long *)(lVar13 + 0xe8) + (long)iVar1 * 4) = uVar3;
      uVar14 = uVar14 + 1;
    } while (uVar14 < *(uint *)pCut >> 0x1c);
    pVVar10 = p->vDecs;
    if (0 < pVVar10->nSize) {
      lVar13 = 0;
      do {
        plVar5 = (long *)pVVar10->pArray[lVar13];
        if (0 < *(int *)((long)plVar5 + 0x2c)) {
          lVar15 = 0;
          lVar12 = lVar13;
          do {
            plVar6 = *(long **)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                               (long)*(int *)(plVar5[6] + lVar15 * 4) * 8);
            lVar7 = *plVar6;
            iVar1 = (int)plVar6[2];
            Vec_IntFillExtra((Vec_Int_t *)(lVar7 + 0xe0),iVar1 + 1,(int)lVar12);
            if (((long)iVar1 < 0) || (*(int *)(lVar7 + 0xe4) <= iVar1)) {
LAB_002a2caa:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            lVar12 = extraout_RDX;
            if ((*(int *)(*(long *)(lVar7 + 0xe8) + (long)iVar1 * 4) != *(int *)(*plVar6 + 0xd8)) &&
               ((*(uint *)((long)plVar6 + 0x14) & 0xf) != 3)) {
              plVar8 = *(long **)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                                 (long)*(int *)plVar6[4] * 8);
              lVar7 = *plVar8;
              iVar1 = (int)plVar8[2];
              Vec_IntFillExtra((Vec_Int_t *)(lVar7 + 0xe0),iVar1 + 1,(int)extraout_RDX);
              if (((long)iVar1 < 0) || (*(int *)(lVar7 + 0xe4) <= iVar1)) goto LAB_002a2caa;
              lVar12 = extraout_RDX_00;
              if (*(int *)(*(long *)(lVar7 + 0xe8) + (long)iVar1 * 4) == *(int *)(*plVar8 + 0xd8)) {
                plVar8 = *(long **)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                                   (long)*(int *)(plVar6[4] + 4) * 8);
                lVar7 = *plVar8;
                iVar1 = (int)plVar8[2];
                Vec_IntFillExtra((Vec_Int_t *)(lVar7 + 0xe0),iVar1 + 1,(int)extraout_RDX_00);
                if (((long)iVar1 < 0) || (*(int *)(lVar7 + 0xe4) <= iVar1)) goto LAB_002a2caa;
                lVar12 = extraout_RDX_01;
                if (*(int *)(*(long *)(lVar7 + 0xe8) + (long)iVar1 * 4) == *(int *)(*plVar8 + 0xd8))
                {
                  pVVar10 = p->vDecs;
                  uVar2 = pVVar10->nSize;
                  if (uVar2 == pVVar10->nCap) {
                    if ((int)uVar2 < 0x10) {
                      if (pVVar10->pArray == (void **)0x0) {
                        ppvVar9 = (void **)malloc(0x80);
                      }
                      else {
                        ppvVar9 = (void **)realloc(pVVar10->pArray,0x80);
                      }
                      pVVar10->pArray = ppvVar9;
                      pVVar10->nCap = 0x10;
                    }
                    else {
                      if (pVVar10->pArray == (void **)0x0) {
                        ppvVar9 = (void **)malloc((ulong)uVar2 << 4);
                      }
                      else {
                        ppvVar9 = (void **)realloc(pVVar10->pArray,(ulong)uVar2 << 4);
                      }
                      pVVar10->pArray = ppvVar9;
                      pVVar10->nCap = uVar2 * 2;
                    }
                  }
                  else {
                    ppvVar9 = pVVar10->pArray;
                  }
                  iVar1 = pVVar10->nSize;
                  iVar11 = iVar1 + 1;
                  pVVar10->nSize = iVar11;
                  ppvVar9[iVar1] = plVar6;
                  lVar12 = *plVar6;
                  iVar1 = (int)plVar6[2];
                  uVar3 = *(undefined4 *)(lVar12 + 0xd8);
                  Vec_IntFillExtra((Vec_Int_t *)(lVar12 + 0xe0),iVar1 + 1,iVar11);
                  if (((long)iVar1 < 0) || (*(int *)(lVar12 + 0xe4) <= iVar1)) goto LAB_002a2cc9;
                  *(undefined4 *)(*(long *)(lVar12 + 0xe8) + (long)iVar1 * 4) = uVar3;
                  lVar12 = extraout_RDX_02;
                }
              }
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 < *(int *)((long)plVar5 + 0x2c));
          pVVar10 = p->vDecs;
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < pVVar10->nSize);
    }
  }
  return 1;
}

Assistant:

int Abc_Abc_NodeResubCollectDivs( Abc_ManRst_t * p, Abc_Obj_t * pRoot, Cut_Cut_t * pCut )
{
    Abc_Obj_t * pNode, * pFanout;
    int i, k;
    // collect the leaves of the cut
    Vec_PtrClear( p->vDecs );
    Abc_NtkIncrementTravId( pRoot->pNtk );
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
    {
        pNode = Abc_NtkObj(pRoot->pNtk, pCut->pLeaves[i]);
        if ( pNode == NULL )  // the so-called "bad cut phenomenon" is due to removed nodes
            return 0;
        Vec_PtrPush( p->vDecs, pNode );
        Abc_NodeSetTravIdCurrent( pNode );        
    }
    // explore the fanouts
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vDecs, pNode, i )
    {
        // if the fanout has both fanins in the set, add it
        Abc_ObjForEachFanout( pNode, pFanout, k )
        {
            if ( Abc_NodeIsTravIdCurrent(pFanout) || Abc_ObjIsPo(pFanout) )
                continue;
            if ( Abc_NodeIsTravIdCurrent(Abc_ObjFanin0(pFanout)) && Abc_NodeIsTravIdCurrent(Abc_ObjFanin1(pFanout)) )
            {
                Vec_PtrPush( p->vDecs, pFanout );
                Abc_NodeSetTravIdCurrent( pFanout );     
            }
        }
    }
    return 1;
}